

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int CVodeGetNumJtimesEvals(void *cvode_mem,long *njvevals)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetNumJtimesEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *njvevals = local_18->njtimes;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumJtimesEvals(void *cvode_mem, long int *njvevals)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeGetNumJtimesEvals",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);
  *njvevals = cvls_mem->njtimes;
  return(CVLS_SUCCESS);
}